

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

urlencode * __thiscall cppcms::filters::urlencode::operator=(urlencode *this,urlencode *other)

{
  to_stream_type p_Var1;
  to_string_type p_Var2;
  type_info *ptVar3;
  
  if (other != this) {
    p_Var1 = (other->obj_).to_stream_;
    p_Var2 = (other->obj_).to_string_;
    ptVar3 = (other->obj_).type_;
    (this->obj_).ptr_ = (other->obj_).ptr_;
    (this->obj_).to_stream_ = p_Var1;
    (this->obj_).to_string_ = p_Var2;
    (this->obj_).type_ = ptVar3;
  }
  return this;
}

Assistant:

urlencode const &urlencode::operator=(urlencode const &other){ obj_ = other.obj_; return *this; }